

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signals.cpp
# Opt level: O2

void llvm::sys::RunSignalHandlers(void)

{
  bool bVar1;
  undefined8 in_RAX;
  long lVar2;
  undefined4 uStack_38;
  Status Expected;
  
  _uStack_38 = in_RAX;
  for (lVar2 = 0x10; lVar2 != 0xd0; lVar2 = lVar2 + 0x18) {
    _uStack_38 = CONCAT44(2,uStack_38);
    bVar1 = std::atomic<CallbackAndCookie::Status>::compare_exchange_strong
                      ((atomic<CallbackAndCookie::Status> *)
                       ((long)&CallBacksToRun[0].Callback + lVar2),&Expected,Executing,
                       memory_order_seq_cst);
    if (bVar1) {
      (**(code **)(&commandLineFitsWithinSystemLimits(llvm::StringRef,llvm::ArrayRef<llvm::StringRef>)
                    ::ArgMax + lVar2))(*(undefined8 *)(lVar2 + 0x1e0db8));
      *(undefined8 *)
       (&commandLineFitsWithinSystemLimits(llvm::StringRef,llvm::ArrayRef<llvm::StringRef>)::ArgMax
       + lVar2) = 0;
      *(undefined8 *)(lVar2 + 0x1e0db8) = 0;
      LOCK();
      *(undefined4 *)((long)&CallBacksToRun[0].Callback + lVar2) = 0;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void sys::RunSignalHandlers() {
  for (size_t I = 0; I < MaxSignalHandlerCallbacks; ++I) {
    auto &RunMe = CallBacksToRun[I];
    auto Expected = CallbackAndCookie::Status::Initialized;
    auto Desired = CallbackAndCookie::Status::Executing;
    if (!RunMe.Flag.compare_exchange_strong(Expected, Desired))
      continue;
    (*RunMe.Callback)(RunMe.Cookie);
    RunMe.Callback = nullptr;
    RunMe.Cookie = nullptr;
    RunMe.Flag.store(CallbackAndCookie::Status::Empty);
  }
}